

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int ipc_dialer_set(void *arg,char *nm,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_setopt(ipc_dialer_options,nm,arg,buf,sz,t);
  return iVar1;
}

Assistant:

static int
ipc_dialer_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_setopt(ipc_ep_options, name, ep, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_dialer_set(ep->dialer, name, buf, sz, t);
	}
	return (rv);
}